

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::WireFormatLite::VerifyUtf8String
          (WireFormatLite *this,char *data,int size,Operation op,string_view field_name)

{
  undefined1 in_AL;
  int iVar1;
  undefined4 in_register_0000000c;
  char *pcVar2;
  char *pcVar3;
  string_view message_name;
  string_view field_name_00;
  
  message_name._M_str._4_4_ = in_register_0000000c;
  message_name._M_str._0_4_ = op;
  iVar1 = utf8_range_IsValid((char *)this,(long)(int)data);
  if (iVar1 == 0) {
    pcVar2 = "serializing";
    if (size != 1) {
      pcVar2 = (char *)0x0;
    }
    pcVar3 = "parsing";
    if (size != 0) {
      pcVar3 = pcVar2;
    }
    message_name._M_len = (size_t)"";
    field_name_00._M_str = pcVar3;
    field_name_00._M_len = field_name._M_len;
    PrintUTF8ErrorLog((internal *)0x0,message_name,field_name_00,(char *)0x0,(bool)in_AL);
  }
  return iVar1 != 0;
}

Assistant:

bool WireFormatLite::VerifyUtf8String(const char* data, int size, Operation op,
                                      const absl::string_view field_name) {
  if (!utf8_range::IsStructurallyValid({data, static_cast<size_t>(size)})) {
    const char* operation_str = nullptr;
    switch (op) {
      case PARSE:
        operation_str = "parsing";
        break;
      case SERIALIZE:
        operation_str = "serializing";
        break;
        // no default case: have the compiler warn if a case is not covered.
    }
    PrintUTF8ErrorLog("", field_name, operation_str, false);
    return false;
  }
  return true;
}